

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefactor.c
# Opt level: O0

Dec_Graph_t *
Abc_NodeRefactor(Abc_ManRef_t *p,Abc_Obj_t *pNode,Vec_Ptr_t *vFanins,int fUpdateLevel,int fUseZeros,
                int fUseDcs,int fVerbose)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  word *pTruth_00;
  abctime aVar4;
  void *pvVar5;
  Dec_Node_t *pDVar6;
  Abc_ManRef_t *local_80;
  int local_74;
  int Required;
  int nNodesAdded;
  int nNodesSaved;
  int i;
  abctime clk;
  word *pTruth;
  Abc_Obj_t *pFanin;
  Dec_Graph_t *pFForm;
  int nWordsMax;
  int nVars;
  int fVeryVerbose;
  int fUseDcs_local;
  int fUseZeros_local;
  int fUpdateLevel_local;
  Vec_Ptr_t *vFanins_local;
  Abc_Obj_t *pNode_local;
  Abc_ManRef_t *p_local;
  
  iVar1 = Vec_PtrSize(vFanins);
  iVar2 = Abc_Truth6WordNum(p->nNodeSizeMax);
  p->nNodesConsidered = p->nNodesConsidered + 1;
  if (fUpdateLevel == 0) {
    local_74 = 1000000000;
  }
  else {
    local_74 = Abc_ObjRequiredLevel(pNode);
  }
  aVar3 = Abc_Clock();
  pTruth_00 = Abc_NodeConeTruth(p->vVars,p->vFuncs,iVar2,pNode,vFanins,p->vVisited);
  aVar4 = Abc_Clock();
  p->timeTru = (aVar4 - aVar3) + p->timeTru;
  if (pTruth_00 == (word *)0x0) {
    p_local = (Abc_ManRef_t *)0x0;
  }
  else {
    iVar2 = Abc_NodeConeIsConst0(pTruth_00,iVar1);
    if ((iVar2 == 0) && (iVar2 = Abc_NodeConeIsConst1(pTruth_00,iVar1), iVar2 == 0)) {
      aVar3 = Abc_Clock();
      p_local = (Abc_ManRef_t *)Kit_TruthToGraph((uint *)pTruth_00,iVar1,p->vMemory);
      aVar4 = Abc_Clock();
      p->timeFact = (aVar4 - aVar3) + p->timeFact;
      for (nNodesAdded = 0; iVar1 = Vec_PtrSize(vFanins), nNodesAdded < iVar1;
          nNodesAdded = nNodesAdded + 1) {
        pvVar5 = Vec_PtrEntry(vFanins,nNodesAdded);
        *(int *)((long)pvVar5 + 0x2c) = *(int *)((long)pvVar5 + 0x2c) + 1;
      }
      Abc_NtkIncrementTravId(pNode->pNtk);
      iVar1 = Abc_NodeMffcLabelAig(pNode);
      for (nNodesAdded = 0; iVar2 = Vec_PtrSize(vFanins), nNodesAdded < iVar2;
          nNodesAdded = nNodesAdded + 1) {
        pvVar5 = Vec_PtrEntry(vFanins,nNodesAdded);
        *(int *)((long)pvVar5 + 0x2c) = *(int *)((long)pvVar5 + 0x2c) + -1;
        pDVar6 = Dec_GraphNode((Dec_Graph_t *)p_local,nNodesAdded);
        (pDVar6->field_2).pFunc = pvVar5;
      }
      aVar3 = Abc_Clock();
      iVar2 = Dec_GraphToNetworkCount(pNode,(Dec_Graph_t *)p_local,iVar1,local_74);
      aVar4 = Abc_Clock();
      p->timeEval = (aVar4 - aVar3) + p->timeEval;
      if ((iVar2 == -1) || ((iVar2 == iVar1 && (fUseZeros == 0)))) {
        Dec_GraphFree((Dec_Graph_t *)p_local);
        p_local = (Abc_ManRef_t *)0x0;
      }
      else {
        p->nLastGain = iVar1 - iVar2;
        p->nNodesGained = p->nLastGain + p->nNodesGained;
        p->nNodesRefactored = p->nNodesRefactored + 1;
      }
    }
    else {
      iVar2 = Abc_NodeMffcSize(pNode);
      p->nLastGain = iVar2;
      p->nNodesGained = p->nLastGain + p->nNodesGained;
      p->nNodesRefactored = p->nNodesRefactored + 1;
      iVar1 = Abc_NodeConeIsConst0(pTruth_00,iVar1);
      if (iVar1 == 0) {
        local_80 = (Abc_ManRef_t *)Dec_GraphCreateConst1();
      }
      else {
        local_80 = (Abc_ManRef_t *)Dec_GraphCreateConst0();
      }
      p_local = local_80;
    }
  }
  return (Dec_Graph_t *)p_local;
}

Assistant:

Dec_Graph_t * Abc_NodeRefactor( Abc_ManRef_t * p, Abc_Obj_t * pNode, Vec_Ptr_t * vFanins, int fUpdateLevel, int fUseZeros, int fUseDcs, int fVerbose )
{
    extern int    Dec_GraphToNetworkCount( Abc_Obj_t * pRoot, Dec_Graph_t * pGraph, int NodeMax, int LevelMax );
    int fVeryVerbose = 0;
    int nVars = Vec_PtrSize(vFanins);
    int nWordsMax = Abc_Truth6WordNum(p->nNodeSizeMax);
    Dec_Graph_t * pFForm;
    Abc_Obj_t * pFanin;
    word * pTruth;
    abctime clk;
    int i, nNodesSaved, nNodesAdded, Required;

    p->nNodesConsidered++;

    Required = fUpdateLevel? Abc_ObjRequiredLevel(pNode) : ABC_INFINITY;

    // get the function of the cut
clk = Abc_Clock();
    pTruth = Abc_NodeConeTruth( p->vVars, p->vFuncs, nWordsMax, pNode, vFanins, p->vVisited );
p->timeTru += Abc_Clock() - clk;
    if ( pTruth == NULL )
        return NULL;

    // always accept the case of constant node
    if ( Abc_NodeConeIsConst0(pTruth, nVars) || Abc_NodeConeIsConst1(pTruth, nVars) )
    {
        p->nLastGain = Abc_NodeMffcSize( pNode );
        p->nNodesGained += p->nLastGain;
        p->nNodesRefactored++;
        return Abc_NodeConeIsConst0(pTruth, nVars) ? Dec_GraphCreateConst0() : Dec_GraphCreateConst1();
    }

    // get the factored form
clk = Abc_Clock();
    pFForm = (Dec_Graph_t *)Kit_TruthToGraph( (unsigned *)pTruth, nVars, p->vMemory );
p->timeFact += Abc_Clock() - clk;

    // mark the fanin boundary 
    // (can mark only essential fanins, belonging to bNodeFunc!)
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanins, pFanin, i )
        pFanin->vFanouts.nSize++;
    // label MFFC with current traversal ID
    Abc_NtkIncrementTravId( pNode->pNtk );
    nNodesSaved = Abc_NodeMffcLabelAig( pNode );
    // unmark the fanin boundary and set the fanins as leaves in the form
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanins, pFanin, i )
    {
        pFanin->vFanouts.nSize--;
        Dec_GraphNode(pFForm, i)->pFunc = pFanin;
    }

    // detect how many new nodes will be added (while taking into account reused nodes)
clk = Abc_Clock();
    nNodesAdded = Dec_GraphToNetworkCount( pNode, pFForm, nNodesSaved, Required );
p->timeEval += Abc_Clock() - clk;
    // quit if there is no improvement
    if ( nNodesAdded == -1 || (nNodesAdded == nNodesSaved && !fUseZeros) )
    {
        Dec_GraphFree( pFForm );
        return NULL;
    }

    // compute the total gain in the number of nodes
    p->nLastGain = nNodesSaved - nNodesAdded;
    p->nNodesGained += p->nLastGain;
    p->nNodesRefactored++;

    // report the progress
    if ( fVeryVerbose )
    {
        printf( "Node %6s : ",  Abc_ObjName(pNode) );
        printf( "Cone = %2d. ", vFanins->nSize );
        printf( "FF = %2d. ",   1 + Dec_GraphNodeNum(pFForm) );
        printf( "MFFC = %2d. ", nNodesSaved );
        printf( "Add = %2d. ",  nNodesAdded );
        printf( "GAIN = %2d. ", p->nLastGain );
        printf( "\n" );
    }
    return pFForm;
}